

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtFont.h
# Opt level: O2

void __thiscall
ft::Font::Font(Font *this,Library *library,string *fontFile,int ptsize,int faceIndex,bool monochrome
              )

{
  FT_Face_conflict *ppFVar1;
  FT_Fixed FVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  FT_Face_conflict pFVar6;
  runtime_error *this_00;
  Exception *pEVar7;
  uint uVar8;
  allocator local_41;
  string local_40;
  
  this->library = library;
  this->face = (FT_Face_conflict)0x0;
  this->totalHeight = 0;
  this->monochrome_ = monochrome;
  if (library->library == (FT_Library)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Library is not initialized");
  }
  else {
    ppFVar1 = &this->face;
    iVar3 = FT_New_Face(library->library,(fontFile->_M_dataplus)._M_p,(long)faceIndex,ppFVar1);
    if (iVar3 != 0) {
      if (iVar3 == 2) {
        pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_40,"Unsupported font format",&local_41);
        Exception::Exception(pEVar7,&local_40,2);
        __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
      }
      pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_40,"Couldn\'t load font file",&local_41);
      Exception::Exception(pEVar7,&local_40,iVar3);
      __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
    }
    pFVar6 = *ppFVar1;
    if (pFVar6->charmap != (FT_CharMap)0x0) {
      if ((pFVar6->face_flags & 1) == 0) {
        iVar3 = pFVar6->num_fixed_sizes + -1;
        if (ptsize < pFVar6->num_fixed_sizes) {
          iVar3 = ptsize;
        }
        this->font_size_family = iVar3;
        FT_Set_Pixel_Sizes(pFVar6,(int)pFVar6->available_sizes[iVar3].width,
                           (int)pFVar6->available_sizes[iVar3].height);
        pFVar6 = this->face;
        iVar3 = (int)pFVar6->available_sizes[iVar3].height;
        this->height = iVar3;
        this->yMax = iVar3;
        this->yMin = 0;
        this->ascent = iVar3;
        this->descent = 0;
      }
      else {
        iVar3 = FT_Set_Pixel_Sizes(pFVar6,ptsize,ptsize);
        if (iVar3 != 0) {
          FT_Done_Face();
          pEVar7 = (Exception *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string((string *)&local_40,"Couldn\'t set font size",&local_41);
          Exception::Exception(pEVar7,&local_40,iVar3);
          __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
        }
        FVar2 = ((*ppFVar1)->size->metrics).y_scale;
        uVar4 = FT_MulFix(((*ppFVar1)->bbox).yMin,FVar2);
        this->yMin = (int)(uVar4 >> 6);
        lVar5 = FT_MulFix((this->face->bbox).yMax,FVar2);
        this->yMax = (int)(lVar5 + 0x3fU >> 6);
        lVar5 = lroundf((float)(this->face->size->metrics).height * 0.015625);
        this->height = (int)lVar5;
        lVar5 = FT_MulFix((long)this->face->ascender,FVar2);
        this->ascent = (int)(lVar5 + 0x3fU >> 6);
        uVar4 = FT_MulFix((long)this->face->descender,FVar2);
        this->descent = (int)(uVar4 >> 6);
        pFVar6 = this->face;
      }
      uVar8 = (uint)pFVar6->style_flags >> 1 & 1;
      this->face_style = uVar8;
      if ((pFVar6->style_flags & 1) != 0) {
        uVar8 = uVar8 | 2;
        this->face_style = uVar8;
      }
      this->style = uVar8;
      this->outline = 0;
      this->kerning = 1;
      this->glyph_overhang = (pFVar6->size->metrics).y_ppem / 10;
      this->glyph_italics = (float)this->height * 0.207;
      this->totalHeight = this->yMax - this->yMin;
      return;
    }
    FT_Done_Face();
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Font doesn\'t contain a Unicode charmap");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Font(Library& library, const std::string& fontFile, int ptsize, const int faceIndex, const bool monochrome)
        : library(library), monochrome_(monochrome)
    {
        if (!library.library)
            throw std::runtime_error("Library is not initialized");

        auto error = FT_New_Face(library.library, fontFile.c_str(), faceIndex, &face);
        if (error == FT_Err_Unknown_File_Format)
            throw Exception("Unsupported font format", error);
        if (error)
            throw Exception("Couldn't load font file", error);

        if (!face->charmap)
        {
            FT_Done_Face(face);
            throw std::runtime_error("Font doesn't contain a Unicode charmap");
        }

        if (FT_IS_SCALABLE(face))
        {
            /* Set the character size and use default DPI (72) */
            error = FT_Set_Pixel_Sizes(face, ptsize, ptsize);
            if (error) {
                FT_Done_Face(face);
                throw Exception("Couldn't set font size", error);
            }

            /* Get the scalable font metrics for this font */
            const auto scale = face->size->metrics.y_scale;
            yMin = FT_FLOOR(FT_MulFix(face->bbox.yMin, scale));
            yMax  = FT_CEIL(FT_MulFix(face->bbox.yMax, scale));
            // height  = FT_CEIL(FT_MulFix(face->height, scale));
            height =  std::lround(static_cast<float>(face->size->metrics.height) / static_cast<float>(1 << 6));
            //height =  std::lround(FT_MulFix(face->height, scale) / static_cast<float>(1 << 6));
            ascent = FT_CEIL(FT_MulFix(face->ascender, scale));
            //ascent = std::lround(FT_MulFix(face->ascender, scale) / static_cast<float>(1 << 6));
            descent = FT_FLOOR(FT_MulFix(face->descender, scale));
        }
        else
        {
            /* Non-scalable font case.  ptsize determines which family
             * or series of fonts to grab from the non-scalable format.
             * It is not the point size of the font.
             * */
            if (ptsize >= face->num_fixed_sizes)
                ptsize = face->num_fixed_sizes - 1;
            font_size_family = ptsize;
            error = FT_Set_Pixel_Sizes( face,
                                    static_cast<FT_UInt>(face->available_sizes[ptsize].width),
                                    static_cast<FT_UInt>(face->available_sizes[ptsize].height ));
            //TODO: check error, free font

            /* With non-scalale fonts, Freetype2 likes to fill many of the
             * font metrics with the value of 0.  The size of the
             * non-scalable fonts must be determined differently
             * or sometimes cannot be determined.
             * */
            height = face->available_sizes[ptsize].height;
            yMax = height;
            yMin = 0;
            ascent = height;
            descent = 0;
        }

        /* Initialize the font face style */
        face_style = TTF_STYLE_NORMAL;
        if (face->style_flags & FT_STYLE_FLAG_BOLD)
            face_style |= TTF_STYLE_BOLD;

        if (face->style_flags & FT_STYLE_FLAG_ITALIC)
            face_style |= TTF_STYLE_ITALIC;

        /* Set the default font style */
        style = face_style;
        outline = 0;
        kerning = 1;
        glyph_overhang = face->size->metrics.y_ppem / 10;
        /* x offset = cos(((90.0-12)/360)*2*M_PI), or 12 degree angle */
        glyph_italics = 0.207f;
        glyph_italics *= height;

        totalHeight = yMax - yMin;


    }